

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

t_int * sigrzero_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  lVar2 = w[1];
  lVar3 = w[2];
  lVar4 = w[3];
  lVar5 = w[4];
  fVar8 = *(float *)(lVar5 + 0x34);
  uVar7 = 0;
  uVar6 = (ulong)*(uint *)(w + 5);
  if ((int)*(uint *)(w + 5) < 1) {
    uVar6 = uVar7;
  }
  for (; (int)uVar6 != (int)uVar7; uVar7 = uVar7 + 1) {
    fVar1 = *(float *)(lVar2 + uVar7 * 4);
    *(float *)(lVar4 + uVar7 * 4) = fVar1 - fVar8 * *(float *)(lVar3 + uVar7 * 4);
    fVar8 = fVar1;
  }
  *(float *)(lVar5 + 0x34) = fVar8;
  return w + 6;
}

Assistant:

static t_int *sigrzero_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    t_sigrzero *x = (t_sigrzero *)(w[4]);
    int n = (int)w[5];
    int i;
    t_sample last = x->x_last;
    for (i = 0; i < n; i++)
    {
        t_sample next = *in1++;
        t_sample coef = *in2++;
        *out++ = next - coef * last;
        last = next;
    }
    x->x_last = last;
    return (w+6);
}